

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

bool rcg::loadStreamableParameters
               (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  undefined8 uVar1;
  element_type *peVar2;
  byte in_DL;
  _Ios_Openmode in_ESI;
  exception *ex;
  GenericException *ex_1;
  ifstream in;
  CFeatureBag bag;
  bool ret;
  CFeatureBag *in_stack_000005b8;
  istream *in_stack_000005c0;
  long local_240 [67];
  CFeatureBag local_28 [22];
  byte local_12;
  byte local_11;
  _Ios_Openmode local_10;
  
  local_11 = in_DL & 1;
  local_12 = 0;
  local_10 = in_ESI;
  GenApi_3_4::CFeatureBag::CFeatureBag(local_28);
  std::ifstream::ifstream(local_240);
  uVar1 = *(undefined8 *)(local_240[0] + -0x18);
  std::operator|(_S_failbit,_S_badbit);
  std::ios::exceptions((int)local_240 + (int)uVar1);
  std::ifstream::open((char *)local_240,local_10);
  GenApi_3_4::operator>>(in_stack_000005c0,in_stack_000005b8);
  std::ifstream::close();
  peVar2 = std::
           __shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x135aa3);
  GenApi_3_4::CFeatureBag::LoadFromBag
            ((INodeMap *)local_28,
             SUB81((peVar2->super_CNodeMapRefT<GenApi_3_4::CGeneric_XMLLoaderParams>)._Ptr,0),
             (gcstring_vector *)0x1);
  local_12 = 1;
  std::ifstream::~ifstream(local_240);
  GenApi_3_4::CFeatureBag::~CFeatureBag(local_28);
  return (bool)(local_12 & 1);
}

Assistant:

bool loadStreamableParameters(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
  bool exception)
{
  bool ret=false;

  try
  {
    GenApi::CFeatureBag bag;

    std::ifstream in;
    in.exceptions(std::ios_base::failbit | std::ios_base::badbit);

    in.open(name);
    in >> bag;
    in.close();

    bag.LoadFromBag(nodemap->_Ptr, true);

    ret=true;
  }
  catch (const std::exception &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }
  catch (const GENICAM_NAMESPACE::GenericException &ex)
  {
    if (exception)
    {
      throw std::invalid_argument(ex.what());
    }
  }

  return ret;
}